

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<std::array<tinyusdz::value::half,_3UL>_> *value)

{
  bool bVar1;
  half3 local_28;
  half3 v;
  optional<std::array<tinyusdz::value::half,_3UL>_> *value_local;
  AsciiParser *this_local;
  
  _v = value;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::operator=(_v);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ReadBasicType(this,&local_28);
    if (bVar1) {
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,3ul>>::operator=
                ((optional<std::array<tinyusdz::value::half,3ul>> *)_v,&local_28);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::half3> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::half3 v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}